

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

int __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::as_integer<int>
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *this)

{
  json_storage_kind jVar1;
  bool bVar2;
  uint16_t uVar3;
  const_pointer length;
  undefined8 uVar4;
  half_storage *this_00;
  double_storage *this_01;
  int64_storage *this_02;
  int64_t iVar5;
  uint64_storage *this_03;
  uint64_t uVar6;
  bool_storage *this_04;
  json_runtime_error<std::domain_error,_void> *this_05;
  char *__s;
  allocator<char> *in_RDI;
  double dVar7;
  type tVar8;
  error_code eVar9;
  type result;
  int val;
  string *in_stack_fffffffffffffef8;
  json_runtime_error<std::runtime_error,_void> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 uVar10;
  undefined1 in_stack_ffffffffffffff47;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *in_stack_ffffffffffffff60;
  string_view_type local_48;
  string_view_type local_38;
  wchar_t *local_28;
  to_integer_errc local_20;
  undefined4 in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  uint local_4;
  
  jVar1 = storage_kind((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                       in_RDI);
  __s = (char *)(ulong)(byte)(jVar1 - boolean);
  switch(__s) {
  case (char *)0x0:
    this_04 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
              cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::bool_storage>
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                         in_stack_ffffffffffffff00);
    bVar2 = bool_storage::value(this_04);
    local_4 = (uint)bVar2;
    break;
  case (char *)0x1:
    this_02 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
              cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::int64_storage>
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                         in_stack_ffffffffffffff00);
    iVar5 = int64_storage::value(this_02);
    local_4 = (uint)iVar5;
    break;
  case (char *)0x2:
    this_03 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
              cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::uint64_storage>
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                         in_stack_ffffffffffffff00);
    uVar6 = uint64_storage::value(this_03);
    local_4 = (uint)uVar6;
    break;
  default:
    uVar10 = 1;
    this_05 = (json_runtime_error<std::domain_error,_void> *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffff47,CONCAT16(uVar10,in_stack_ffffffffffffff40)),__s,
               in_RDI);
    json_runtime_error<std::domain_error,_void>::json_runtime_error
              (this_05,in_stack_fffffffffffffef8);
    __cxa_throw(this_05,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case (char *)0x4:
    this_01 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
              cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::double_storage>
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                         in_stack_ffffffffffffff00);
    dVar7 = double_storage::value(this_01);
    local_4 = (uint)dVar7;
    break;
  case (char *)0x5:
    this_00 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
              cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::half_storage>
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                         in_stack_ffffffffffffff00);
    uVar3 = half_storage::value(this_00);
    local_4 = (uint)uVar3;
    break;
  case (char *)0x6:
  case (char *)0xe:
    local_38 = as_string_view(in_stack_ffffffffffffff60);
    length = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(&local_38);
    local_48 = as_string_view(in_stack_ffffffffffffff60);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(&local_48);
    tVar8 = detail::to_integer<int,wchar_t>
                      ((wchar_t *)in_RDI,(size_t)length,
                       (int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    local_28 = tVar8.ptr;
    local_20 = tVar8.ec;
    bVar2 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_28);
    local_4 = in_stack_ffffffffffffffec;
    if (!bVar2) {
      uVar4 = __cxa_allocate_exception(0x18);
      eVar9 = detail::to_integer_result<int,_wchar_t>::error_code
                        ((to_integer_result<int,_wchar_t> *)0xcb3323);
      std::error_code::message_abi_cxx11_((error_code *)eVar9._M_cat);
      json_runtime_error<std::runtime_error,_void>::json_runtime_error
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      __cxa_throw(uVar4,&json_runtime_error<std::runtime_error,void>::typeinfo,
                  json_runtime_error<std::runtime_error,_void>::~json_runtime_error);
    }
    break;
  case (char *)0x7:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::json_const_reference_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
               in_stack_ffffffffffffff00);
    json_const_reference_storage::value((json_const_reference_storage *)0xcb34a5);
    local_4 = as_integer<int>((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>
                               *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    break;
  case (char *)0x8:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>::json_reference_storage>
              ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
               in_stack_ffffffffffffff00);
    json_reference_storage::value((json_reference_storage *)0xcb34cb);
    local_4 = as_integer<int>((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>
                               *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return local_4;
}

Assistant:

IntegerType as_integer() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    IntegerType val;
                    auto result = jsoncons::detail::to_integer(as_string_view().data(), as_string_view().length(), val);
                    if (!result)
                    {
                        JSONCONS_THROW(json_runtime_error<std::runtime_error>(result.error_code().message()));
                    }
                    return val;
                }
                case json_storage_kind::half_float:
                    return static_cast<IntegerType>(cast<half_storage>().value());
                case json_storage_kind::float64:
                    return static_cast<IntegerType>(cast<double_storage>().value());
                case json_storage_kind::int64:
                    return static_cast<IntegerType>(cast<int64_storage>().value());
                case json_storage_kind::uint64:
                    return static_cast<IntegerType>(cast<uint64_storage>().value());
                case json_storage_kind::boolean:
                    return static_cast<IntegerType>(cast<bool_storage>().value() ? 1 : 0);
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().template as_integer<IntegerType>();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().template as_integer<IntegerType>();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not an integer"));
            }
        }